

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_14cf1db::QChildProcess::~QChildProcess(QChildProcess *this)

{
  Data *pDVar1;
  _Head_base<0UL,_char_**,_false> _Var2;
  EVP_PKEY_CTX *in_RSI;
  
  cleanup(this,in_RSI);
  pDVar1 = (this->envp).data.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->envp).data.d.d)->super_QArrayData,1,0x10);
    }
  }
  _Var2._M_head_impl =
       (this->envp).pointers._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t
       .super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
       super__Head_base<0UL,_char_**,_false>._M_head_impl;
  if (_Var2._M_head_impl != (char **)0x0) {
    operator_delete__(_Var2._M_head_impl);
  }
  (this->envp).pointers._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
  super__Head_base<0UL,_char_**,_false>._M_head_impl = (char **)0x0;
  pDVar1 = (this->argv).data.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->argv).data.d.d)->super_QArrayData,1,0x10);
    }
  }
  _Var2._M_head_impl =
       (this->argv).pointers._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t
       .super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
       super__Head_base<0UL,_char_**,_false>._M_head_impl;
  if (_Var2._M_head_impl != (char **)0x0) {
    operator_delete__(_Var2._M_head_impl);
  }
  (this->argv).pointers._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
  super__Head_base<0UL,_char_**,_false>._M_head_impl = (char **)0x0;
  return;
}

Assistant:

~QChildProcess() noexcept(false)
    {
        cleanup();
    }